

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

int __thiscall QTableView::sizeHintForColumn(QTableView *this,int column)

{
  QPersistentModelIndex *this_00;
  QTableViewPrivate *this_01;
  QWidgetData *pQVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int logicalIndex;
  QAbstractItemModel *pQVar7;
  int iVar8;
  int visualIndex;
  long in_FS_OFFSET;
  QStyleOptionViewItem option;
  int local_178;
  int local_174;
  QModelIndex local_158;
  QModelIndex local_140;
  QModelIndex local_128;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar7 = QAbstractItemView::model((QAbstractItemView *)this);
  if (pQVar7 == (QAbstractItemModel *)0x0) {
    local_174 = -1;
  }
  else {
    QWidget::ensurePolished((QWidget *)this);
    iVar4 = QHeaderView::resizeContentsPrecision(this_01->horizontalHeader);
    iVar5 = QHeaderView::visualIndexAt(this_01->verticalHeader,0);
    visualIndex = 0;
    if (0 < iVar5) {
      visualIndex = iVar5;
    }
    pQVar1 = ((this_01->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    local_178 = QHeaderView::visualIndexAt
                          (this_01->verticalHeader,
                           ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1);
    if ((local_178 == -1) ||
       ((((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.data)
         ->widget_attributes & 0x8000) == 0)) {
      pQVar7 = (this_01->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_108,&(this_01->super_QAbstractItemViewPrivate).root);
      local_178 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7,&local_108);
      local_178 = local_178 + -1;
    }
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(this,&local_108);
    local_128.r = -1;
    local_128.c = -1;
    local_128.i = 0;
    local_128.m.ptr = (QAbstractItemModel *)0x0;
    iVar5 = 0;
    local_174 = 0;
    iVar8 = visualIndex;
    if (visualIndex <= local_178) {
      local_174 = 0;
      iVar5 = 0;
      do {
        iVar6 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar8);
        bVar3 = QHeaderView::isSectionHidden(this_01->verticalHeader,iVar6);
        if (bVar3) {
          bVar3 = false;
        }
        else {
          pQVar7 = (this_01->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    (&local_158,&(this_01->super_QAbstractItemViewPrivate).root);
          (**(code **)(*(long *)pQVar7 + 0x60))(&local_140,pQVar7,iVar6,column,&local_158);
          local_128.m.ptr = local_140.m.ptr;
          local_128.r = local_140.r;
          local_128.c = local_140.c;
          local_128.i = local_140.i;
          local_174 = QTableViewPrivate::widthHintForIndex(this_01,&local_128,local_174,&local_108);
          iVar5 = iVar5 + 1;
          bVar3 = iVar5 == iVar4;
        }
      } while ((!bVar3) && (iVar8 = iVar8 + 1, local_178 + 1 != iVar8));
    }
    pQVar7 = (this_01->super_QAbstractItemViewPrivate).model;
    this_00 = &(this_01->super_QAbstractItemViewPrivate).root;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_140,this_00);
    iVar6 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7,&local_140);
    if ((iVar5 != iVar4 && iVar4 != 0) && visualIndex < iVar6) {
      iVar6 = iVar6 + -1;
      iVar8 = iVar8 + -1;
      do {
        if ((visualIndex < 1) && (iVar6 <= iVar8)) break;
        if ((((byte)iVar5 & 0 < visualIndex) == 0) && (iVar8 != iVar6)) {
          iVar2 = iVar6;
          if (iVar6 < iVar8) {
            iVar2 = iVar8;
          }
          do {
            logicalIndex = -1;
            if (iVar2 == iVar8) break;
            iVar8 = iVar8 + 1;
            logicalIndex = QHeaderView::logicalIndex(this_01->verticalHeader,iVar8);
            bVar3 = QHeaderView::isSectionHidden(this_01->verticalHeader,logicalIndex);
          } while (bVar3);
        }
        else {
          do {
            logicalIndex = -1;
            if (visualIndex < 1) break;
            visualIndex = visualIndex + -1;
            logicalIndex = QHeaderView::logicalIndex(this_01->verticalHeader,visualIndex);
            bVar3 = QHeaderView::isSectionHidden(this_01->verticalHeader,logicalIndex);
          } while (bVar3);
        }
        if (-1 < logicalIndex) {
          pQVar7 = (this_01->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_158,this_00);
          (**(code **)(*(long *)pQVar7 + 0x60))(&local_140,pQVar7,logicalIndex,column,&local_158);
          local_128.m.ptr = local_140.m.ptr;
          local_128.r = local_140.r;
          local_128.c = local_140.c;
          local_128.i = local_140.i;
          local_174 = QTableViewPrivate::widthHintForIndex(this_01,&local_128,local_174,&local_108);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != iVar4);
    }
    bVar3 = this_01->showGrid;
    QBrush::~QBrush(&local_108.backgroundBrush);
    if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_174 = local_174 + (uint)bVar3;
    QIcon::~QIcon(&local_108.icon);
    QLocale::~QLocale(&local_108.locale);
    QFont::~QFont(&local_108.font);
    QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_174;
  }
  __stack_chk_fail();
}

Assistant:

int QTableView::sizeHintForColumn(int column) const
{
    Q_D(const QTableView);

    if (!model())
        return -1;

    ensurePolished();
    const int maximumProcessRows = d->horizontalHeader->resizeContentsPrecision();

    int top = qMax(0, d->verticalHeader->visualIndexAt(0));
    int bottom = d->verticalHeader->visualIndexAt(d->viewport->height());
    if (!isVisible() || bottom == -1) // the table don't have enough rows to fill the viewport
        bottom = d->model->rowCount(d->root) - 1;

    QStyleOptionViewItem option;
    initViewItemOption(&option);

    int hint = 0;
    int rowsProcessed = 0;
    QModelIndex index;
    int row = top;
    for (; row <= bottom; ++row) {
        int logicalRow = d->verticalHeader->logicalIndex(row);
        if (d->verticalHeader->isSectionHidden(logicalRow))
            continue;
        index = d->model->index(logicalRow, column, d->root);

        hint = d->widthHintForIndex(index, hint, option);
        ++rowsProcessed;
        if (rowsProcessed == maximumProcessRows)
            break;
    }

    const int actualBottom = d->model->rowCount(d->root) - 1;
    int idxTop = top;
    int idxBottom = row - 1;

    if (maximumProcessRows == 0 || actualBottom < idxTop)
        rowsProcessed = maximumProcessRows;  // skip the while loop

    while (rowsProcessed != maximumProcessRows && (idxTop > 0 || idxBottom < actualBottom)) {
        int logicalIdx  = -1;

        if ((rowsProcessed % 2 && idxTop > 0) || idxBottom == actualBottom) {
            while (idxTop > 0) {
                --idxTop;
                int logrow = d->verticalHeader->logicalIndex(idxTop);
                if (d->verticalHeader->isSectionHidden(logrow))
                    continue;
                logicalIdx = logrow;
                break;
            }
        } else {
            while (idxBottom < actualBottom) {
                ++idxBottom;
                int logrow = d->verticalHeader->logicalIndex(idxBottom);
                if (d->verticalHeader->isSectionHidden(logrow))
                    continue;
                logicalIdx = logrow;
                break;
            }
        }
        if (logicalIdx >= 0) {
            index = d->model->index(logicalIdx, column, d->root);
            hint = d->widthHintForIndex(index, hint, option);
        }
        ++rowsProcessed;
    }

    return d->showGrid ? hint + 1 : hint;
}